

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O1

int xz_lzma_bidder_init(archive_read_filter *self)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  
  __ptr = calloc(1,0xb8);
  __ptr_00 = malloc(0x10000);
  if (__ptr == (void *)0x0 || __ptr_00 == (void *)0x0) {
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for xz decompression");
    free(__ptr_00);
    free(__ptr);
LAB_001171b2:
    iVar1 = -0x1e;
  }
  else {
    self->data = __ptr;
    *(undefined8 *)((long)__ptr + 0x90) = 0x10000;
    *(void **)((long)__ptr + 0x88) = __ptr_00;
    self->vtable = &xz_lzma_reader_vtable;
    *(undefined8 *)((long)__ptr + 8) = 0;
    *(void **)((long)__ptr + 0x18) = __ptr_00;
    *(undefined8 *)((long)__ptr + 0x20) = 0x10000;
    *(undefined4 *)((long)__ptr + 0xa4) = 0;
    iVar1 = self->code;
    if (iVar1 == 9) {
      *(undefined1 *)((long)__ptr + 0xa1) = 0;
    }
    else {
      *(undefined1 *)((long)__ptr + 0xa1) = 1;
      if (iVar1 == 6) {
        iVar1 = lzma_stream_decoder(__ptr,0xffffffffffffffff,8);
      }
      else {
        iVar1 = lzma_alone_decoder(__ptr,0xffffffffffffffff);
      }
      if (iVar1 != 0) {
        set_error(self,iVar1);
        free(*(void **)((long)__ptr + 0x88));
        free(__ptr);
        self->data = (void *)0x0;
        goto LAB_001171b2;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
xz_lzma_bidder_init(struct archive_read_filter *self)
{
	static const size_t out_block_size = 64 * 1024;
	void *out_block;
	struct private_data *state;
	int ret;

	state = calloc(1, sizeof(*state));
	out_block = malloc(out_block_size);
	if (state == NULL || out_block == NULL) {
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for xz decompression");
		free(out_block);
		free(state);
		return (ARCHIVE_FATAL);
	}

	self->data = state;
	state->out_block_size = out_block_size;
	state->out_block = out_block;
	self->vtable = &xz_lzma_reader_vtable;

	state->stream.avail_in = 0;

	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	state->crc32 = 0;
	if (self->code == ARCHIVE_FILTER_LZIP) {
		/*
		 * We have to read a lzip header and use it to initialize
		 * compression library, thus we cannot initialize the
		 * library for lzip here.
		 */
		state->in_stream = 0;
		return (ARCHIVE_OK);
	} else
		state->in_stream = 1;

	/* Initialize compression library. */
	if (self->code == ARCHIVE_FILTER_XZ)
		ret = lzma_stream_decoder(&(state->stream),
		    LZMA_MEMLIMIT,/* memlimit */
		    LZMA_CONCATENATED);
	else
		ret = lzma_alone_decoder(&(state->stream),
		    LZMA_MEMLIMIT);/* memlimit */

	if (ret == LZMA_OK)
		return (ARCHIVE_OK);

	/* Library setup failed: Choose an error message and clean up. */
	set_error(self, ret);

	free(state->out_block);
	free(state);
	self->data = NULL;
	return (ARCHIVE_FATAL);
}